

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidRankInconsistency(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ActivationParams *pAVar5;
  Tensor *pTVar6;
  ArenaStringPtr *pAVar7;
  ostream *poVar8;
  undefined1 local_e8 [8];
  Result res;
  NeuralNetworkLayer *l2;
  NeuralNetworkLayer *l;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"A",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"C",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  pAVar5 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(this_01);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar5);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this_01->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_01->name_,"relu1",pAVar3);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"B");
  pTVar6 = CoreML::Specification::NeuralNetworkLayer::add_outputtensor(this_01);
  CoreML::Specification::Tensor::set_rank(pTVar6,1);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  pAVar5 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar5);
  pAVar7 = (ArenaStringPtr *)(res.m_message.field_2._8_8_ + 0x70);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)res.m_message.field_2._8_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar7,"relu2",pAVar3);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"C");
  pTVar6 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor
                     ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::Specification::Tensor::set_rank(pTVar6,2);
  CoreML::validate<(MLModelType)500>((Result *)local_e8,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_e8);
  if (m._oneof_case_[0]._0_1_) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x12ce);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_e8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);

    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);


    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}